

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O1

void fts5ParseSetColset(Fts5Parse *pParse,Fts5ExprNode *pNode,Fts5Colset *pColset,
                       Fts5Colset **ppFree)

{
  size_t __n;
  int iVar1;
  Fts5ExprNearset *pFVar2;
  Fts5Colset *pFVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  long lVar7;
  
  if (pParse->rc != 0) {
    return;
  }
  if ((pNode->eType == 4) || (pNode->eType == 9)) {
    pFVar2 = pNode->pNear;
    pFVar3 = pFVar2->pColset;
    if (pFVar3 == (Fts5Colset *)0x0) {
      if (*ppFree == (Fts5Colset *)0x0) {
        if (pColset == (Fts5Colset *)0x0) {
          pFVar3 = (Fts5Colset *)0x0;
        }
        else {
          __n = (long)pColset->nCol * 4 + 4;
          pFVar3 = (Fts5Colset *)sqlite3Fts5MallocZero(&pParse->rc,__n);
          if (pFVar3 != (Fts5Colset *)0x0) {
            memcpy(pFVar3,pColset,__n);
          }
        }
        pFVar2->pColset = pFVar3;
      }
      else {
        pFVar2->pColset = pColset;
        *ppFree = (Fts5Colset *)0x0;
      }
    }
    else {
      if (pFVar3->nCol < 1) {
        iVar4 = 0;
      }
      else {
        iVar5 = 0;
        iVar4 = 0;
        iVar6 = 0;
        do {
          if (pColset->nCol <= iVar6) break;
          iVar1 = pColset->aiCol[iVar6];
          if (pFVar3->aiCol[iVar5] == iVar1) {
            lVar7 = (long)iVar4;
            iVar4 = iVar4 + 1;
            pFVar3->aiCol[lVar7] = iVar1;
            iVar6 = iVar6 + 1;
LAB_001a8cba:
            iVar5 = iVar5 + 1;
          }
          else {
            if (pFVar3->aiCol[iVar5] <= iVar1) goto LAB_001a8cba;
            iVar6 = iVar6 + 1;
          }
        } while (iVar5 < pFVar3->nCol);
      }
      pFVar3->nCol = iVar4;
      if (iVar4 == 0) {
        pNode->eType = 0;
        pNode->xNext = (_func_int_Fts5Expr_ptr_Fts5ExprNode_ptr_int_i64 *)0x0;
      }
    }
  }
  else if (0 < pNode->nChild) {
    lVar7 = 0;
    do {
      fts5ParseSetColset(pParse,pNode->apChild[lVar7],pColset,ppFree);
      lVar7 = lVar7 + 1;
    } while (lVar7 < pNode->nChild);
  }
  return;
}

Assistant:

static void fts5ParseSetColset(
  Fts5Parse *pParse, 
  Fts5ExprNode *pNode, 
  Fts5Colset *pColset,
  Fts5Colset **ppFree
){
  if( pParse->rc==SQLITE_OK ){
    assert( pNode->eType==FTS5_TERM || pNode->eType==FTS5_STRING 
         || pNode->eType==FTS5_AND  || pNode->eType==FTS5_OR
         || pNode->eType==FTS5_NOT  || pNode->eType==FTS5_EOF
    );
    if( pNode->eType==FTS5_STRING || pNode->eType==FTS5_TERM ){
      Fts5ExprNearset *pNear = pNode->pNear;
      if( pNear->pColset ){
        fts5MergeColset(pNear->pColset, pColset);
        if( pNear->pColset->nCol==0 ){
          pNode->eType = FTS5_EOF;
          pNode->xNext = 0;
        }
      }else if( *ppFree ){
        pNear->pColset = pColset;
        *ppFree = 0;
      }else{
        pNear->pColset = fts5CloneColset(&pParse->rc, pColset);
      }
    }else{
      int i;
      assert( pNode->eType!=FTS5_EOF || pNode->nChild==0 );
      for(i=0; i<pNode->nChild; i++){
        fts5ParseSetColset(pParse, pNode->apChild[i], pColset, ppFree);
      }
    }
  }
}